

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O3

void __thiscall google::CapturedStream::CapturedStream(CapturedStream *this,int fd,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->fd_ = fd;
  (this->uncaptured_fd_).fd_ = -1;
  paVar1 = &(this->filename_).field_2;
  (this->filename_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (filename->_M_dataplus)._M_p;
  paVar2 = &filename->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&filename->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->filename_).field_2 + 8) = uVar4;
  }
  else {
    (this->filename_)._M_dataplus._M_p = pcVar3;
    (this->filename_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->filename_)._M_string_length = filename->_M_string_length;
  (filename->_M_dataplus)._M_p = (pointer)paVar2;
  filename->_M_string_length = 0;
  (filename->field_2)._M_local_buf[0] = '\0';
  Capture(this);
  return;
}

Assistant:

CapturedStream(int fd, string filename)
      : fd_(fd), filename_(std::move(filename)) {
    Capture();
  }